

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::CompMatFuncBase<4,_3>::doApply
          (IRet *__return_storage_ptr__,CompMatFuncBase<4,_3> *this,EvalContext *ctx,IArgs *iargs)

{
  IArgs *ctx_00;
  Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *this_00;
  Vector<tcu::Interval,_4> *pVVar1;
  Interval *pIVar2;
  Interval *arg1;
  Void local_5e;
  Void local_5d [13];
  IRet local_50;
  int local_34;
  int local_30;
  int row;
  int col;
  IArgs *iargs_local;
  EvalContext *ctx_local;
  CompMatFuncBase<4,_3> *this_local;
  IRet *ret;
  
  row._3_1_ = 0;
  _col = iargs;
  iargs_local = (IArgs *)ctx;
  ctx_local = (EvalContext *)this;
  this_local = (CompMatFuncBase<4,_3> *)__return_storage_ptr__;
  tcu::Matrix<tcu::Interval,_4,_3>::Matrix(__return_storage_ptr__);
  for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
    for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
      this_00 = (Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
                 *)(**(code **)(*(long *)this + 0x58))();
      ctx_00 = iargs_local;
      pVVar1 = tcu::Matrix<tcu::Interval,_4,_3>::operator[](_col->a,local_30);
      pIVar2 = tcu::Vector<tcu::Interval,_4>::operator[](pVVar1,local_34);
      pVVar1 = tcu::Matrix<tcu::Interval,_4,_3>::operator[](_col->b,local_30);
      arg1 = tcu::Vector<tcu::Interval,_4>::operator[](pVVar1,local_34);
      Void::Void(local_5d);
      Void::Void(&local_5e);
      Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
      ::apply(&local_50,this_00,(EvalContext *)ctx_00,pIVar2,arg1,local_5d,&local_5e);
      pVVar1 = tcu::Matrix<tcu::Interval,_4,_3>::operator[](__return_storage_ptr__,local_30);
      pIVar2 = tcu::Vector<tcu::Interval,_4>::operator[](pVVar1,local_34);
      pIVar2->m_hasNaN = local_50.m_hasNaN;
      *(undefined7 *)&pIVar2->field_0x1 = local_50._1_7_;
      pIVar2->m_lo = local_50.m_lo;
      pIVar2->m_hi = local_50.m_hi;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IRet	doApply	(const EvalContext& ctx, const IArgs& iargs) const
	{
		IRet			ret;

		for (int col = 0; col < Cols; ++col)
		{
			for (int row = 0; row < Rows; ++row)
				ret[col][row] = this->doGetScalarFunc().apply(ctx,
															  iargs.a[col][row],
															  iargs.b[col][row]);
		}

		return ret;
	}